

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_packet_socket.c
# Opt level: O0

void oonf_packet_copy_managed_config
               (oonf_packet_managed_config *dst,oonf_packet_managed_config *src)

{
  oonf_packet_managed_config *src_local;
  oonf_packet_managed_config *dst_local;
  
  oonf_packet_free_managed_config(dst);
  memcpy(dst,src,0xa0);
  memset(dst,0,0x28);
  memset(&dst->bindto,0,0x28);
  netaddr_acl_copy(&dst->acl,&src->acl);
  netaddr_acl_copy(&dst->bindto,&src->bindto);
  return;
}

Assistant:

void
oonf_packet_copy_managed_config(struct oonf_packet_managed_config *dst, const struct oonf_packet_managed_config *src) {
  oonf_packet_free_managed_config(dst);

  /* careful, we are doing a shallow copy, so both ACLs are BAD after this */
  memcpy(dst, src, sizeof(*dst));

  /* fix it to make sure we don't use-after-free or double-free */
  memset(&dst->acl, 0, sizeof(dst->acl));
  memset(&dst->bindto, 0, sizeof(dst->bindto));

  /* now do a deep copy of the ACLs */
  netaddr_acl_copy(&dst->acl, &src->acl);
  netaddr_acl_copy(&dst->bindto, &src->bindto);
}